

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_connect(_glist *x,t_floatarg fwhoout,t_floatarg foutno,t_floatarg fwhoin,
                   t_floatarg finno)

{
  char *pcVar1;
  uint uVar2;
  uint n1;
  uint uVar3;
  uint n2;
  int iVar4;
  int iVar5;
  t_object *ob1;
  t_object *ob2;
  _outconnect *p_Var6;
  _glist *p_Var7;
  undefined8 in_stack_fffffffffffffe78;
  uint uVar8;
  undefined8 in_stack_fffffffffffffe80;
  uint uVar9;
  char *local_140;
  char *local_130;
  t_object *local_100;
  char **local_f8;
  char *tags [2];
  char tag [128];
  int nout;
  int nin;
  _outconnect *oc;
  t_object *objsink;
  t_object *objsrc;
  t_gobj *sink;
  t_gobj *src;
  int inno;
  int whoin;
  int outno;
  int whoout;
  t_floatarg finno_local;
  t_floatarg fwhoin_local;
  t_floatarg foutno_local;
  t_floatarg fwhoout_local;
  _glist *x_local;
  
  uVar2 = (uint)fwhoout;
  n1 = (uint)foutno;
  uVar3 = (uint)fwhoin;
  n2 = (uint)finno;
  objsrc = (t_object *)0x0;
  src._4_4_ = uVar3;
  whoin = uVar2;
  if (*(_glist **)((pd_maininstance.pd_gui)->i_editor + 0x70) == x) {
    whoin = *(int *)((pd_maininstance.pd_gui)->i_editor + 0x68) + uVar2;
    src._4_4_ = *(int *)((pd_maininstance.pd_gui)->i_editor + 0x68) + uVar3;
  }
  sink = x->gl_list;
  for (; whoin != 0; whoin = whoin + -1) {
    if (sink->g_next == (_gobj *)0x0) {
      sink = (t_gobj *)0x0;
      logpost((void *)0x0,3,"cannot connect non-existing object");
      goto LAB_0015808c;
    }
    sink = sink->g_next;
  }
  objsrc = (t_object *)x->gl_list;
  do {
    if (src._4_4_ == 0) {
      ob1 = pd_checkobject(&sink->g_pd);
      if ((ob1 == (t_object *)0x0) || (ob2 = pd_checkobject((t_pd *)objsrc), ob2 == (t_object *)0x0)
         ) {
        if (sink == (t_gobj *)0x0) {
          local_100 = objsrc;
        }
        else {
          local_100 = (t_object *)sink;
        }
        logpost(local_100,3,"cannot connect unpatchable object");
      }
      else {
        iVar4 = canvas_isconnected(x,ob1,n1,ob2,n2);
        if (iVar4 == 0) {
          if ((sink->g_pd == text_class) && ((ob1->field_0x2e & 3) == 1)) {
            while (iVar4 = obj_noutlets(ob1), iVar4 <= (int)n1) {
              outlet_new(ob1,(t_symbol *)0x0);
            }
          }
          uVar9 = (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20);
          uVar8 = (uint)((ulong)in_stack_fffffffffffffe78 >> 0x20);
          if (((objsrc->te_g).g_pd == text_class) && ((ob2->field_0x2e & 3) == 1)) {
            while( true ) {
              iVar4 = obj_ninlets(ob2);
              uVar9 = (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20);
              uVar8 = (uint)((ulong)in_stack_fffffffffffffe78 >> 0x20);
              if ((int)n2 < iVar4) break;
              inlet_new(ob2,(t_pd *)ob2,(t_symbol *)0x0,(t_symbol *)0x0);
            }
          }
          p_Var6 = obj_connect(ob1,n1,ob2,n2);
          if (p_Var6 != (_outconnect *)0x0) {
            iVar4 = glist_isvisible(x);
            if (iVar4 == 0) {
              return;
            }
            if ((*(ushort *)&x->field_0xe8 & 1) == 0) {
              return;
            }
            local_f8 = tags + 1;
            tags[0] = "cord";
            sprintf((char *)(tags + 1),"l%lx",p_Var6);
            p_Var7 = glist_getcanvas(x);
            iVar5 = obj_issignaloutlet(ob1,n1);
            iVar4 = 1;
            if (iVar5 != 0) {
              iVar4 = 2;
            }
            pdgui_vmess((char *)0x0,"crr iiii ri rS",p_Var7,"create","line",0,(ulong)uVar8 << 0x20,
                        (ulong)uVar9 << 0x20,0,"-width",iVar4 * x->gl_zoom,"-tags",2,&local_f8);
            canvas_fixlinesfor(x,ob1);
            return;
          }
        }
        else {
          logpost(sink,3,"io pair already connected");
        }
      }
LAB_0015808c:
      pcVar1 = x->gl_name->s_name;
      if (sink == (t_gobj *)0x0) {
        local_130 = "???";
      }
      else {
        local_130 = class_getname(sink->g_pd);
      }
      if (objsrc == (t_object *)0x0) {
        local_140 = "???";
      }
      else {
        local_140 = class_getname((objsrc->te_g).g_pd);
      }
      post("%s %d %d %d %d (%s->%s) connection failed",pcVar1,(ulong)uVar2,(ulong)n1,(ulong)uVar3,
           (ulong)n2,local_130,local_140);
      return;
    }
    if ((objsrc->te_g).g_next == (_gobj *)0x0) {
      objsrc = (t_object *)0x0;
      logpost(sink,3,"cannot connect to non-existing object");
      goto LAB_0015808c;
    }
    objsrc = (t_object *)(objsrc->te_g).g_next;
    src._4_4_ = src._4_4_ - 1;
  } while( true );
}

Assistant:

void canvas_connect(t_canvas *x, t_floatarg fwhoout, t_floatarg foutno,
    t_floatarg fwhoin, t_floatarg finno)
{
    int whoout = fwhoout, outno = foutno, whoin = fwhoin, inno = finno;
    t_gobj *src = 0, *sink = 0;
    t_object *objsrc, *objsink;
    t_outconnect *oc;
    int nin = whoin, nout = whoout;
    if (EDITOR->paste_canvas == x) whoout += EDITOR->paste_onset,
        whoin += EDITOR->paste_onset;
    for (src = x->gl_list; whoout; src = src->g_next, whoout--)
        if (!src->g_next) {
            src = NULL;
            logpost(sink, 3, "cannot connect non-existing object");
            goto bad; /* bug fix thanks to Hannes */
        }
    for (sink = x->gl_list; whoin; sink = sink->g_next, whoin--)
        if (!sink->g_next) {
            sink = NULL;
            logpost(src, 3, "cannot connect to non-existing object");
            goto bad;
        }

        /* check they're both patchable objects */
    if (!(objsrc = pd_checkobject(&src->g_pd)) ||
        !(objsink = pd_checkobject(&sink->g_pd))) {
        logpost(src?src:sink, 3, "cannot connect unpatchable object");
        goto bad;
    }

        /* check if objects are already connected */
    if (canvas_isconnected(x, objsrc, outno, objsink, inno)) {
        logpost(src, 3, "io pair already connected");
        goto bad;
    }

        /* if object creation failed, make dummy inlets or outlets
           as needed */
    if (pd_class(&src->g_pd) == text_class && objsrc->te_type == T_OBJECT)
        while (outno >= obj_noutlets(objsrc))
            outlet_new(objsrc, 0);
    if (pd_class(&sink->g_pd) == text_class && objsink->te_type == T_OBJECT)
        while (inno >= obj_ninlets(objsink))
            inlet_new(objsink, &objsink->ob_pd, 0, 0);

    if (!(oc = obj_connect(objsrc, outno, objsink, inno))) goto bad;
    if (glist_isvisible(x) && x->gl_havewindow)
    {
        char tag[128];
        char*tags[] = {tag, "cord"};
        sprintf(tag, "l%lx", oc);
        pdgui_vmess(0, "crr iiii ri rS",
            glist_getcanvas(x), "create", "line",
            0, 0, 0, 0,
            "-width", (obj_issignaloutlet(objsrc, outno) ? 2 : 1) * x->gl_zoom,
            "-tags", 2, tags);
        canvas_fixlinesfor(x, objsrc);
    }
    return;

bad:
    post("%s %d %d %d %d (%s->%s) connection failed",
        x->gl_name->s_name, nout, outno, nin, inno,
            (src? class_getname(pd_class(&src->g_pd)) : "???"),
            (sink? class_getname(pd_class(&sink->g_pd)) : "???"));
}